

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  U32 UVar2;
  uint target;
  U32 UVar3;
  
  mls = (ms->cParams).minMatch;
  pBVar1 = (ms->window).base;
  target = (int)ip - (int)pBVar1;
  for (UVar3 = ms->nextToUpdate; UVar3 < target; UVar3 = UVar3 + UVar2) {
    UVar2 = ZSTD_insertBt1(ms,pBVar1 + UVar3,iend,target,mls,0);
  }
  ms->nextToUpdate = target;
  return;
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}